

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O3

bool ktx::operator==(SelectorRange *var)

{
  bool bVar1;
  SelectorRange local_28;
  
  SelectorRange::SelectorRange(&local_28,0,0xffffffff);
  bVar1 = operator==(var,&local_28);
  if (local_28.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool operator==(const SelectorRange& var, All_t) {
        return var == SelectorRange{all};
    }